

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O0

void kj::UnixEventPort::captureSignal(int signum)

{
  Fault local_30;
  Fault f_1;
  Fault local_18;
  Fault f;
  int signum_local;
  
  f.exception._4_4_ = signum;
  if ((anonymous_namespace)::reservedSignal == 10) {
    if (signum == 10) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[144]>
                (&local_18,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix.c++"
                 ,0xf2,FAILED,"signum != SIGUSR1",
                 "\"Sorry, SIGUSR1 is reserved by the UnixEventPort implementation.  You may call \" \"UnixEventPort::setReservedSignal() to reserve a different signal.\""
                 ,(char (*) [144])
                  "Sorry, SIGUSR1 is reserved by the UnixEventPort implementation.  You may call UnixEventPort::setReservedSignal() to reserve a different signal."
                );
      kj::_::Debug::Fault::fatal(&local_18);
    }
  }
  else if (signum == (anonymous_namespace)::reservedSignal) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[57],int&>
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix.c++"
               ,0xf5,FAILED,"signum != reservedSignal",
               "\"Can\'t capture signal reserved using setReservedSignal().\", signum",
               (char (*) [57])"Can\'t capture signal reserved using setReservedSignal().",
               (int *)((long)&f.exception + 4));
    kj::_::Debug::Fault::fatal(&local_30);
  }
  anon_unknown_6::registerSignalHandler(signum);
  return;
}

Assistant:

void UnixEventPort::captureSignal(int signum) {
  if (reservedSignal == SIGUSR1) {
    KJ_REQUIRE(signum != SIGUSR1,
               "Sorry, SIGUSR1 is reserved by the UnixEventPort implementation.  You may call "
               "UnixEventPort::setReservedSignal() to reserve a different signal.");
  } else {
    KJ_REQUIRE(signum != reservedSignal,
               "Can't capture signal reserved using setReservedSignal().", signum);
  }
  registerSignalHandler(signum);
}